

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void allocate_gf_group_bits
               (GF_GROUP *gf_group,PRIMARY_RATE_CONTROL *p_rc,RATE_CONTROL *rc,int64_t gf_group_bits
               ,int gf_arf_bits,int key_frame,int use_arf)

{
  int iVar1;
  uint uVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int idx_1;
  int arf_extra_bits;
  double fraction;
  int layer_extra_bits [7];
  int i;
  int idx;
  int max_arf_layer;
  int num_frames;
  int frame_index;
  int layer_frames [7];
  int gf_group_size;
  int base_frame_bits;
  int64_t total_group_bits;
  int local_bc;
  int local_b4;
  double local_a8;
  int local_9c;
  uint local_98;
  int local_88 [7];
  int local_6c;
  uint local_68;
  int local_64;
  int local_60;
  uint local_5c;
  int local_58 [8];
  int local_38;
  int local_34;
  long local_30;
  int local_28;
  int local_24;
  long local_18;
  long local_10;
  long local_8;
  
  local_38 = *(int *)(in_RDI + 0x1878);
  local_30 = in_RCX;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_58,0,0x1c);
  local_5c = (uint)(local_28 != 0);
  if (in_stack_00000008 != 0) {
    local_30 = local_30 - local_24;
  }
  if ((int)(*(int *)(local_10 + 0x2130) - (uint)(*(int *)(local_18 + 0x30) == 0)) < 1) {
    local_9c = 1;
  }
  else {
    local_9c = *(int *)(local_10 + 0x2130) - (uint)(*(int *)(local_18 + 0x30) == 0);
  }
  local_60 = local_9c;
  local_34 = (int)(local_30 / (long)local_9c);
  local_64 = *(int *)(local_8 + 0xac0) + -1;
  for (local_68 = (uint)(local_28 != 0); (int)local_68 < local_38; local_68 = local_68 + 1) {
    if ((*(char *)(local_8 + (int)local_68) == '\x03') ||
       (*(char *)(local_8 + (int)local_68) == '\x06')) {
      iVar1 = *(int *)(local_8 + 0x2f0 + (long)(int)local_68 * 4);
      local_58[iVar1] = local_58[iVar1] + 1;
    }
  }
  memset(local_88,0,0x1c);
  for (local_6c = 1; local_6c <= local_64; local_6c = local_6c + 1) {
    if (local_6c == local_64) {
      local_a8 = 1.0;
    }
    else {
      local_a8 = allocate_gf_group_bits::layer_fraction[local_6c];
    }
    if (local_58[local_6c] < 1) {
      local_b4 = 1;
    }
    else {
      local_b4 = local_58[local_6c];
    }
    local_88[local_6c] = (int)(((double)local_24 * local_a8) / (double)local_b4);
    local_24 = local_24 - (int)((double)local_24 * local_a8);
  }
  local_98 = local_5c;
  do {
    if (local_38 <= (int)local_98) {
      if (local_38 < 0xfa) {
        *(undefined4 *)(local_8 + 0x1298 + (long)local_38 * 4) = 0;
      }
      return;
    }
    uVar2 = (uint)*(byte *)(local_8 + (int)local_98);
    if (uVar2 == 3) {
LAB_002a27dd:
      if (0x7fffffff - local_88[*(int *)(local_8 + 0x2f0 + (long)(int)local_98 * 4)] < local_34) {
        local_bc = 0x7fffffff;
      }
      else {
        local_bc = local_34 + local_88[*(int *)(local_8 + 0x2f0 + (long)(int)local_98 * 4)];
      }
      *(int *)(local_8 + 0x1298 + (long)(int)local_98 * 4) = local_bc;
    }
    else if (uVar2 - 4 < 2) {
      *(undefined4 *)(local_8 + 0x1298 + (long)(int)local_98 * 4) = 0;
    }
    else {
      if (uVar2 == 6) goto LAB_002a27dd;
      *(int *)(local_8 + 0x1298 + (long)(int)local_98 * 4) = local_34;
    }
    local_98 = local_98 + 1;
  } while( true );
}

Assistant:

static void allocate_gf_group_bits(GF_GROUP *gf_group,
                                   PRIMARY_RATE_CONTROL *const p_rc,
                                   RATE_CONTROL *const rc,
                                   int64_t gf_group_bits, int gf_arf_bits,
                                   int key_frame, int use_arf) {
  static const double layer_fraction[MAX_ARF_LAYERS + 1] = { 1.0,  0.70, 0.55,
                                                             0.60, 0.60, 1.0,
                                                             1.0 };
  int64_t total_group_bits = gf_group_bits;
  int base_frame_bits;
  const int gf_group_size = gf_group->size;
  int layer_frames[MAX_ARF_LAYERS + 1] = { 0 };

  // For key frames the frame target rate is already set and it
  // is also the golden frame.
  // === [frame_index == 0] ===
  int frame_index = !!key_frame;

  // Subtract the extra bits set aside for ARF frames from the Group Total
  if (use_arf) total_group_bits -= gf_arf_bits;

  int num_frames =
      AOMMAX(1, p_rc->baseline_gf_interval - (rc->frames_since_key == 0));
  base_frame_bits = (int)(total_group_bits / num_frames);

  // Check the number of frames in each layer in case we have a
  // non standard group length.
  int max_arf_layer = gf_group->max_layer_depth - 1;
  for (int idx = frame_index; idx < gf_group_size; ++idx) {
    if ((gf_group->update_type[idx] == ARF_UPDATE) ||
        (gf_group->update_type[idx] == INTNL_ARF_UPDATE)) {
      layer_frames[gf_group->layer_depth[idx]]++;
    }
  }

  // Allocate extra bits to each ARF layer
  int i;
  int layer_extra_bits[MAX_ARF_LAYERS + 1] = { 0 };
  assert(max_arf_layer <= MAX_ARF_LAYERS);
  for (i = 1; i <= max_arf_layer; ++i) {
    double fraction = (i == max_arf_layer) ? 1.0 : layer_fraction[i];
    layer_extra_bits[i] =
        (int)((gf_arf_bits * fraction) / AOMMAX(1, layer_frames[i]));
    gf_arf_bits -= (int)(gf_arf_bits * fraction);
  }

  // Now combine ARF layer and baseline bits to give total bits for each frame.
  int arf_extra_bits;
  for (int idx = frame_index; idx < gf_group_size; ++idx) {
    switch (gf_group->update_type[idx]) {
      case ARF_UPDATE:
      case INTNL_ARF_UPDATE:
        arf_extra_bits = layer_extra_bits[gf_group->layer_depth[idx]];
        gf_group->bit_allocation[idx] =
            (base_frame_bits > INT_MAX - arf_extra_bits)
                ? INT_MAX
                : (base_frame_bits + arf_extra_bits);
        break;
      case INTNL_OVERLAY_UPDATE:
      case OVERLAY_UPDATE: gf_group->bit_allocation[idx] = 0; break;
      default: gf_group->bit_allocation[idx] = base_frame_bits; break;
    }
  }

  // Set the frame following the current GOP to 0 bit allocation. For ARF
  // groups, this next frame will be overlay frame, which is the first frame
  // in the next GOP. For GF group, next GOP will overwrite the rate allocation.
  // Setting this frame to use 0 bit (of out the current GOP budget) will
  // simplify logics in reference frame management.
  if (gf_group_size < MAX_STATIC_GF_GROUP_LENGTH)
    gf_group->bit_allocation[gf_group_size] = 0;
}